

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O2

parser_error parse_chest_trap_name(parser *p)

{
  int iVar1;
  char *pcVar2;
  undefined8 *puVar3;
  chest_trap *v;
  
  pcVar2 = parser_getstr(p,"name");
  puVar3 = (undefined8 *)parser_priv(p);
  v = (chest_trap *)mem_zalloc(0x40);
  if (puVar3 == (undefined8 *)0x0) {
    iVar1 = 1;
    chest_traps = v;
  }
  else {
    *puVar3 = v;
    iVar1 = *(int *)(puVar3 + 5) * 2;
  }
  v->pval = iVar1;
  pcVar2 = string_make(pcVar2);
  v->name = pcVar2;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_chest_trap_name(struct parser *p)
{
    const char *name = parser_getstr(p, "name");
    struct chest_trap *h = parser_priv(p);
    struct chest_trap *t = mem_zalloc(sizeof *t);

	/* Order the traps correctly and set the pval */
	if (h) {
		h->next = t;
		t->pval = h->pval * 2;
	} else {
		chest_traps = t;
		t->pval = 1;
	}
    t->name = string_make(name);
    parser_setpriv(p, t);
    return PARSE_ERROR_NONE;
}